

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

IceTBoolean icetMatrixInverseTranspose(IceTDouble *matrix_in,IceTDouble *matrix_out)

{
  IceTBoolean IVar1;
  IceTDouble inverse [16];
  IceTDouble aIStack_88 [16];
  
  IVar1 = icetMatrixInverse(matrix_in,aIStack_88);
  if (IVar1 != '\0') {
    icetMatrixTranspose(aIStack_88,matrix_out);
  }
  return IVar1 != '\0';
}

Assistant:

IceTBoolean icetMatrixInverseTranspose(const IceTDouble *matrix_in,
                                       IceTDouble *matrix_out)
{
    IceTDouble inverse[16];
    IceTBoolean success;

    success = icetMatrixInverse(matrix_in, inverse);
    if (!success) return ICET_FALSE;

    icetMatrixTranspose((const IceTDouble *)inverse, matrix_out);
    return ICET_TRUE;
}